

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O1

void __thiscall QDialogButtonBoxPrivate::retranslateStrings(QDialogButtonBoxPrivate *this)

{
  long lVar1;
  void *pvVar2;
  int *piVar3;
  long lVar4;
  long in_FS_OFFSET;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->standardButtonMap).c.keys.super_QVLABase<QPushButton_*>.super_QVLABaseBase.s;
  if (lVar1 != 0) {
    lVar4 = 0;
    do {
      pvVar2 = (this->standardButtonMap).c.keys.super_QVLABase<QPushButton_*>.super_QVLABaseBase.ptr
      ;
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d._0_4_ = 0xaaaaaaaa;
      local_58.d.d._4_4_ = 0xaaaaaaaa;
      local_58.d.ptr._0_4_ = 0xaaaaaaaa;
      local_58.d.ptr._4_4_ = 0xaaaaaaaa;
      (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x88))
                (&local_58,QGuiApplicationPrivate::platform_theme,
                 *(undefined4 *)
                  ((long)(this->standardButtonMap).c.values.
                         super_QVLABase<QDialogButtonBox::StandardButton>.super_QVLABaseBase.ptr +
                  lVar4 * 4));
      if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
        QAbstractButton::setText(*(QAbstractButton **)((long)pvVar2 + lVar4 * 8),&local_58);
      }
      piVar3 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),2,0x10);
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogButtonBoxPrivate::retranslateStrings()
{
    for (const auto &it : std::as_const(standardButtonMap)) {
        const QString text = QGuiApplicationPrivate::platformTheme()->standardButtonText(it.second);
        if (!text.isEmpty())
            it.first->setText(text);
    }
}